

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DistantLight>::LightNodeImpl
          (LightNodeImpl<embree::SceneGraph::DistantLight> *this,DistantLight *light)

{
  DistantLight *in_RSI;
  undefined8 *in_RDI;
  LightNode *in_stack_ffffffffffffffe0;
  
  LightNode::LightNode(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__LightNodeImpl_0061f5b0;
  DistantLight::DistantLight((DistantLight *)(in_RDI + 0xe),in_RSI);
  return;
}

Assistant:

LightNodeImpl (const Light& light)
        : light(light) {}